

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int validate_typed_array(JSContext *ctx,JSValue this_val)

{
  JSValue this_val_00;
  BOOL BVar1;
  JSObject *p_00;
  undefined8 in_RDX;
  JSContext *in_RSI;
  JSContext *in_RDI;
  JSObject *p;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  this_val_00.tag._0_4_ = in_stack_fffffffffffffff8;
  this_val_00.u = (JSValueUnion)in_RDX;
  this_val_00.tag._4_4_ = in_stack_fffffffffffffffc;
  p_00 = get_typed_array(in_RSI,this_val_00,(int)((ulong)in_RDI >> 0x20));
  if (p_00 == (JSObject *)0x0) {
    iVar2 = -1;
  }
  else {
    BVar1 = typed_array_is_detached(in_RDI,p_00);
    if (BVar1 == 0) {
      iVar2 = 0;
    }
    else {
      JS_ThrowTypeErrorDetachedArrayBuffer((JSContext *)0x1c476e);
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

static int validate_typed_array(JSContext *ctx, JSValueConst this_val)
{
    JSObject *p;
    p = get_typed_array(ctx, this_val, 0);
    if (!p)
        return -1;
    if (typed_array_is_detached(ctx, p)) {
        JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        return -1;
    }
    return 0;
}